

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteNL
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this,
          string *namebase)

{
  bool bVar1;
  int iVar2;
  NLUtils *pNVar3;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this_01;
  FeederType *this_02;
  FILE *__stream;
  int *piVar4;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_RDI;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fln;
  File *in_stack_ffffffffffffff08;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_a8 [8];
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_stack_ffffffffffffff60;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_stack_ffffffffffffff70;
  string local_88 [32];
  string local_68 [8];
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_stack_ffffffffffffffa0;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_stack_ffffffffffffffc0;
  undefined1 local_38 [8];
  string local_30 [48];
  
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  pNVar3 = BinaryFormatter::Utils(&in_RDI->super_FormatterType);
  this_00 = (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *)Hdr(in_RDI);
  (*pNVar3->_vptr_NLUtils[2])
            (local_38,pNVar3,local_30,
             (ulong)((((NLProblemInfo *)&this_00->super_FormatterType)->super_NLProblemInfo_C).
                     num_vars < 1),"wb");
  File::operator=((File *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  File::~File((File *)0x110fbc);
  bVar1 = File::operator_cast_to_bool(&in_RDI->nm);
  if (bVar1) {
    WriteNLHeader(in_stack_000000a0);
    WriteFunctions(this_00);
    WriteSuffixes(in_stack_ffffffffffffff10);
    WritePLSOSConstraints(in_stack_ffffffffffffff10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Feeder(in_RDI);
    bVar1 = NLFeeder<ExampleModel,_void_*>::WantBoundsFirst((NLFeeder<ExampleModel,_void_*> *)__lhs)
    ;
    if (bVar1) {
      WriteVarBounds(in_RDI);
      WriteInitialGuesses(in_stack_ffffffffffffff60);
      WriteConBounds(in_RDI);
      WriteDualInitialGuesses(in_stack_ffffffffffffff60);
    }
    WriteDefinedVariables(in_RDI,(int)((ulong)__lhs >> 0x20));
    WriteConObjExpressions(in_stack_ffffffffffffffc0);
    this_01 = (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *)
              Feeder(in_RDI);
    bVar1 = NLFeeder<ExampleModel,_void_*>::WantBoundsFirst
                      ((NLFeeder<ExampleModel,_void_*> *)this_01);
    if (!bVar1) {
      WriteDualInitialGuesses(in_stack_ffffffffffffff60);
      WriteInitialGuesses(in_stack_ffffffffffffff60);
      WriteConBounds(in_RDI);
      WriteVarBounds(in_RDI);
    }
    this_02 = Feeder(in_RDI);
    iVar2 = NLFeeder<ExampleModel,_void_*>::WantColumnSizes
                      ((NLFeeder<ExampleModel,_void_*> *)this_02);
    if (iVar2 != 0) {
      WriteColumnSizes(in_stack_ffffffffffffff70);
    }
    WriteLinearConExpr(in_stack_ffffffffffffffa0);
    WriteObjGradients(in_stack_ffffffffffffffa0);
    WriteRandomVariables(this_01);
    __stream = (FILE *)File::GetHandle(&in_RDI->nm);
    iVar2 = ferror(__stream);
    if (iVar2 == 0) {
      (in_RDI->result_).first = NLW2_WriteNL_OK;
    }
    else {
      (in_RDI->result_).first = NLW2_WriteNL_Failed;
      std::operator+(in_stack_ffffffffffffff38,(char *)this_00);
      piVar4 = __errno_location();
      strerror(*piVar4);
      std::operator+(__lhs,(char *)this_01);
      std::__cxx11::string::operator=((string *)&(in_RDI->result_).second,local_68);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
    }
  }
  else {
    (in_RDI->result_).first = NLW2_WriteNL_CantOpen;
    std::operator+(in_stack_ffffffffffffff38,(char *)this_00);
    piVar4 = __errno_location();
    strerror(*piVar4);
    std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    std::__cxx11::string::operator=((string *)&(in_RDI->result_).second,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void NLWriter2<Params>::WriteNL(
    const std::string& namebase) {
  auto fln = namebase + ".nl";
  nm = Utils().openf(fln,
                     Hdr().num_vars<=0,     // Delete file if true
                     "wb");
  if (nm) {
    WriteNLHeader();
    WriteFunctions();
    WriteSuffixes();
    WritePLSOSConstraints();
    if (Feeder().WantBoundsFirst()) {
      WriteVarBounds();
      WriteInitialGuesses();
      WriteConBounds();
      WriteDualInitialGuesses();
    }
    WriteDefinedVariables(0);
    WriteConObjExpressions();
    if (!Feeder().WantBoundsFirst()) {
      WriteDualInitialGuesses();
      WriteInitialGuesses();
      WriteConBounds();
      WriteVarBounds();
    }
    if (Feeder().WantColumnSizes())
      WriteColumnSizes();
    WriteLinearConExpr();
    WriteObjGradients();
    WriteRandomVariables();

    if (std::ferror(nm.GetHandle())) {
      result_.first = NLW2_WriteNL_Failed;
      result_.second = fln + ": " + std::strerror(errno);
    } else
      result_.first = NLW2_WriteNL_OK;
  } else {
    result_.first = NLW2_WriteNL_CantOpen;
    result_.second = fln + ": " + std::strerror(errno);
  }
}